

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineDynamicStateCreateInfo *state)

{
  void *pvVar1;
  VkDynamicState *pVVar2;
  deUint32 dVar3;
  VkStructureType VVar4;
  undefined4 uVar5;
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)local_30,
             state->pDynamicStates,state->pDynamicStates + state->dynamicStateCount,&local_31);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::_M_move_assign
            (&this->m_dynamicStates,
             (vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  VVar4 = state->sType;
  uVar5 = *(undefined4 *)&state->field_0x4;
  pvVar1 = state->pNext;
  dVar3 = state->dynamicStateCount;
  pVVar2 = state->pDynamicStates;
  (this->m_dynamicState).flags = state->flags;
  (this->m_dynamicState).dynamicStateCount = dVar3;
  (this->m_dynamicState).pDynamicStates = pVVar2;
  (this->m_dynamicState).sType = VVar4;
  *(undefined4 *)&(this->m_dynamicState).field_0x4 = uVar5;
  (this->m_dynamicState).pNext = pvVar1;
  (this->m_dynamicState).pDynamicStates =
       (this->m_dynamicStates).
       super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_VkGraphicsPipelineCreateInfo).pDynamicState = &this->m_dynamicState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineDynamicStateCreateInfo& state)
{
	m_dynamicStates					= std::vector<vk::VkDynamicState>(state.pDynamicStates, state.pDynamicStates + state.dynamicStateCount);
	m_dynamicState					= state;
	m_dynamicState.pDynamicStates	= &m_dynamicStates[0];
	pDynamicState					= &m_dynamicState;

	return *this;
}